

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_packing_pass.h
# Opt level: O3

Analysis __thiscall spvtools::opt::StructPackingPass::GetPreservedAnalyses(StructPackingPass *this)

{
  return kAnalysisLiveness|kAnalysisDebugInfo|kAnalysisConstants|kAnalysisStructuredCFG|
         kAnalysisScalarEvolution|kAnalysisNameMap|kAnalysisLoopAnalysis|kAnalysisDominatorAnalysis|
         kAnalysisCFG|kAnalysisCombinators;
}

Assistant:

IRContext::Analysis GetPreservedAnalyses() override {
    return IRContext::kAnalysisCombinators | IRContext::kAnalysisCFG |
           IRContext::kAnalysisDominatorAnalysis |
           IRContext::kAnalysisLoopAnalysis | IRContext::kAnalysisNameMap |
           IRContext::kAnalysisScalarEvolution |
           IRContext::kAnalysisStructuredCFG | IRContext::kAnalysisConstants |
           IRContext::kAnalysisDebugInfo | IRContext::kAnalysisLiveness;
  }